

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool QtPrivate::isRightToLeft(QStringView string)

{
  long lVar1;
  QStringView string_00;
  bool bVar2;
  Direction DVar3;
  long in_FS_OFFSET;
  char32_t c;
  int isolateLevel;
  QStringIterator i;
  undefined4 in_stack_ffffffffffffff90;
  char32_t in_stack_ffffffffffffff94;
  QStringIterator *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  bool local_49;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  string_00.m_size._4_4_ = in_stack_ffffffffffffffa4;
  string_00.m_size._0_4_ = in_stack_ffffffffffffffa0;
  string_00.m_data._0_4_ = in_stack_ffffffffffffffa8;
  string_00.m_data._4_4_ = in_stack_ffffffffffffffac;
  QStringIterator::QStringIterator
            (in_stack_ffffffffffffff98,string_00,
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  do {
    bVar2 = QStringIterator::hasNext((QStringIterator *)0x51db03);
    if (!bVar2) {
      local_49 = false;
      goto LAB_0051dbab;
    }
    QStringIterator::next(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    DVar3 = QChar::direction(L'\x0051db3c');
    in_stack_ffffffffffffff98 = (QStringIterator *)(ulong)DVar3;
    switch(in_stack_ffffffffffffff98) {
    case (QStringIterator *)0x0:
      if (local_50 == 0) {
        local_49 = false;
        goto LAB_0051dbab;
      }
      break;
    case (QStringIterator *)0x1:
    case (QStringIterator *)0xd:
      if (local_50 == 0) {
        local_49 = true;
LAB_0051dbab:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return local_49;
      }
      break;
    case (QStringIterator *)0x2:
    case (QStringIterator *)0x3:
    case (QStringIterator *)0x4:
    case (QStringIterator *)0x5:
    case (QStringIterator *)0x6:
    case (QStringIterator *)0x7:
    case (QStringIterator *)0x8:
    case (QStringIterator *)0x9:
    case (QStringIterator *)0xa:
    case (QStringIterator *)0xb:
    case (QStringIterator *)0xc:
    case (QStringIterator *)0xe:
    case (QStringIterator *)0xf:
    case (QStringIterator *)0x10:
    case (QStringIterator *)0x11:
    case (QStringIterator *)0x12:
      break;
    case (QStringIterator *)0x13:
    case (QStringIterator *)0x14:
    case (QStringIterator *)0x15:
      local_50 = local_50 + 1;
      break;
    case (QStringIterator *)0x16:
      if (local_50 != 0) {
        local_50 = local_50 + -1;
      }
    }
  } while( true );
}

Assistant:

bool QtPrivate::isRightToLeft(QStringView string) noexcept
{
    int isolateLevel = 0;

    for (QStringIterator i(string); i.hasNext();) {
        const char32_t c = i.next();

        switch (QChar::direction(c)) {
        case QChar::DirRLI:
        case QChar::DirLRI:
        case QChar::DirFSI:
            ++isolateLevel;
            break;
        case QChar::DirPDI:
            if (isolateLevel)
                --isolateLevel;
            break;
        case QChar::DirL:
            if (isolateLevel)
                break;
            return false;
        case QChar::DirR:
        case QChar::DirAL:
            if (isolateLevel)
                break;
            return true;
        case QChar::DirEN:
        case QChar::DirES:
        case QChar::DirET:
        case QChar::DirAN:
        case QChar::DirCS:
        case QChar::DirB:
        case QChar::DirS:
        case QChar::DirWS:
        case QChar::DirON:
        case QChar::DirLRE:
        case QChar::DirLRO:
        case QChar::DirRLE:
        case QChar::DirRLO:
        case QChar::DirPDF:
        case QChar::DirNSM:
        case QChar::DirBN:
            break;
        }
    }
    return false;
}